

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmNinjaTargetGenerator::ComputeFlagsForObject
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,cmSourceFile *source,
          string *language)

{
  cmGeneratorTarget *headTarget;
  cmLocalNinjaGenerator *lg;
  bool bVar1;
  char *pcVar2;
  string *psVar3;
  cmCompiledGeneratorExpression *this_00;
  string local_110;
  char *local_f0;
  char *evaluatedFlags;
  cmCompiledGeneratorExpression *local_e0;
  auto_ptr<cmCompiledGeneratorExpression> local_d8;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  undefined1 local_b0 [8];
  cmGeneratorExpression ge;
  string config;
  string local_68;
  char *local_48;
  char *cflags;
  undefined1 local_29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  string *language_local;
  cmSourceFile *source_local;
  cmNinjaTargetGenerator *this_local;
  string *flags;
  
  local_29 = 0;
  local_28 = language;
  language_local = (string *)source;
  source_local = (cmSourceFile *)this;
  this_local = (cmNinjaTargetGenerator *)__return_storage_ptr__;
  cmCommonTargetGenerator::GetFlags
            (__return_storage_ptr__,&this->super_cmCommonTargetGenerator,language);
  bVar1 = std::operator==(local_28,"Fortran");
  if (bVar1) {
    cmCommonTargetGenerator::AppendFortranFormatFlags
              (&this->super_cmCommonTargetGenerator,__return_storage_ptr__,
               (cmSourceFile *)language_local);
  }
  psVar3 = language_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_68,"COMPILE_FLAGS",(allocator *)(config.field_2._M_local_buf + 0xf));
  pcVar2 = cmSourceFile::GetProperty((cmSourceFile *)psVar3,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)(config.field_2._M_local_buf + 0xf));
  if (pcVar2 != (char *)0x0) {
    local_48 = pcVar2;
    psVar3 = cmLocalCommonGenerator::GetConfigName_abi_cxx11_
                       (&this->LocalGenerator->super_cmLocalCommonGenerator);
    std::__cxx11::string::string((string *)&ge.Backtrace.Cur,(string *)psVar3);
    cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&cge);
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)local_b0,(cmListFileBacktrace *)&cge);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&cge);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)&evaluatedFlags,local_b0);
    local_e0 = (cmCompiledGeneratorExpression *)
               ::cm::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&evaluatedFlags);
    ::cm::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
              (&local_d8,(auto_ptr_ref<cmCompiledGeneratorExpression>)local_e0);
    ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)&evaluatedFlags);
    this_00 = ::cm::auto_ptr<cmCompiledGeneratorExpression>::operator->(&local_d8);
    headTarget = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    lg = this->LocalGenerator;
    std::__cxx11::string::string((string *)&local_110);
    pcVar2 = cmCompiledGeneratorExpression::Evaluate
                       (this_00,(cmLocalGenerator *)lg,(string *)&ge.Backtrace.Cur,false,headTarget,
                        (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    local_f0 = pcVar2;
    (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
      _vptr_cmLocalGenerator[7])(this->LocalGenerator,__return_storage_ptr__,pcVar2);
    ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_d8);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_b0);
    std::__cxx11::string::~string((string *)&ge.Backtrace.Cur);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::ComputeFlagsForObject(
  cmSourceFile const* source, const std::string& language)
{
  std::string flags = this->GetFlags(language);

  // Add Fortran format flags.
  if (language == "Fortran") {
    this->AppendFortranFormatFlags(flags, *source);
  }

  // Add source file specific flags.
  if (const char* cflags = source->GetProperty("COMPILE_FLAGS")) {
    std::string config = this->LocalGenerator->GetConfigName();
    cmGeneratorExpression ge;
    CM_AUTO_PTR<cmCompiledGeneratorExpression> cge = ge.Parse(cflags);
    const char* evaluatedFlags = cge->Evaluate(this->LocalGenerator, config,
                                               false, this->GeneratorTarget);
    this->LocalGenerator->AppendFlags(flags, evaluatedFlags);
  }

  return flags;
}